

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O3

uint32_t units::getCommodity(string *comm)

{
  int iVar1;
  void *pvVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  uint32_t code;
  uint32_t uVar8;
  string *comm_00;
  long lVar9;
  ulong uVar10;
  char cVar11;
  size_type __pos;
  ulong uVar12;
  size_type __n;
  size_t __n_00;
  char *pcVar13;
  char *__data;
  char *pcVar14;
  long *local_48 [2];
  long local_38 [2];
  
  __n_00 = comm->_M_string_length;
  if (__n_00 != 0) {
    pcVar14 = (comm->_M_dataplus)._M_p;
    pvVar2 = memchr(pcVar14,0x5c,__n_00);
    __pos = (long)pvVar2 - (long)pcVar14;
    if (__pos < __n_00 - 1 && pvVar2 != (void *)0x0) {
      while( true ) {
        uVar5 = (byte)pcVar14[__pos + 1] - 0x5b;
        if (((uVar5 < 0x23) && ((0x500000007U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
           ((byte)pcVar14[__pos + 1] - 0x28 < 2)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,__pos,1);
          pcVar14 = (comm->_M_dataplus)._M_p;
          __n_00 = comm->_M_string_length;
        }
        uVar12 = __pos + 1;
        if (__n_00 < uVar12 || __n_00 - uVar12 == 0) break;
        pvVar2 = memchr(pcVar14 + uVar12,0x5c,__n_00 - uVar12);
        if ((pvVar2 == (void *)0x0) || (__pos = (long)pvVar2 - (long)pcVar14, __n_00 - 1 <= __pos))
        goto LAB_003bc91d;
      }
      if (__n_00 == 0) goto LAB_003bc934;
    }
LAB_003bc91d:
    pcVar13 = pcVar14 + __n_00;
    do {
      iVar1 = tolower((int)*pcVar14);
      *pcVar14 = (char)iVar1;
      pcVar14 = pcVar14 + 1;
    } while (pcVar14 != pcVar13);
  }
LAB_003bc934:
  if (((((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
       (customCommodityCodes_abi_cxx11_._24_8_ != 0)) &&
      (_Var3._M_cur = (__node_type *)
                      std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)customCommodityCodes_abi_cxx11_,comm),
      _Var3._M_cur != (__node_type *)0x0)) ||
     (_Var3._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)commodities::commodity_codes_abi_cxx11_,comm),
     _Var3._M_cur != (__node_type *)0x0)) {
    return *(uint32_t *)
            ((long)&((_Var3._M_cur)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                    ._M_storage._M_storage + 0x20);
  }
  iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)comm,0,7,
                  "cxcomm[");
  if (iVar1 == 0) {
    uVar12 = strtoul((comm->_M_dataplus)._M_p + 7,(char **)0x0,0);
    return (uint32_t)uVar12;
  }
  pcVar13 = (comm->_M_dataplus)._M_p;
  uVar12 = comm->_M_string_length;
  pcVar14 = pcVar13 + uVar12;
  if (uVar12 < 6) {
    pcVar6 = pcVar13;
    if (uVar12 < 4) {
LAB_003bc9c3:
      lVar9 = (long)pcVar14 - (long)pcVar6;
      if (lVar9 == 1) {
LAB_003bca25:
        pcVar7 = pcVar6;
        if (0xe0 < (byte)(*pcVar6 + 0x82U)) {
          pcVar7 = pcVar14;
        }
        if (*pcVar6 == ' ') {
          pcVar7 = pcVar14;
        }
        goto LAB_003bcad0;
      }
      if (lVar9 == 2) {
LAB_003bca02:
        pcVar7 = pcVar6;
        if (*pcVar6 != ' ' && (byte)(*pcVar6 + 0x82U) < 0xe1) goto LAB_003bcad0;
        pcVar6 = pcVar6 + 1;
        goto LAB_003bca25;
      }
      if (lVar9 == 3) {
        pcVar7 = pcVar6;
        if (*pcVar6 != ' ' && (byte)(*pcVar6 + 0x82U) < 0xe1) goto LAB_003bcad0;
        pcVar6 = pcVar6 + 1;
        goto LAB_003bca02;
      }
    }
    else {
      pcVar7 = pcVar13;
      if (*pcVar13 == ' ' || 0xe0 < (byte)(*pcVar13 + 0x82U)) {
        if (pcVar13[1] == ' ' || 0xe0 < (byte)(pcVar13[1] + 0x82U)) {
          if (pcVar13[2] == ' ' || 0xe0 < (byte)(pcVar13[2] + 0x82U)) {
            if (pcVar13[3] == ' ' || 0xe0 < (byte)(pcVar13[3] + 0x82U)) {
              pcVar6 = pcVar13 + ((uint)uVar12 & 4);
              goto LAB_003bc9c3;
            }
            pcVar7 = pcVar13 + 3;
          }
          else {
            pcVar7 = pcVar13 + 2;
          }
        }
        else {
          pcVar7 = pcVar13 + 1;
        }
      }
LAB_003bcad0:
      if (pcVar7 != pcVar14) {
        if (uVar12 != 0) goto LAB_003bcae2;
        comm_00 = (string *)0x60000025;
        goto LAB_003bcb0f;
      }
    }
    if (uVar12 == 0) {
      uVar8 = 0x40000000;
    }
    else {
      uVar8 = 0x40000000;
      uVar10 = 0;
      bVar4 = 0;
      do {
        cVar11 = pcVar13[uVar10] + -0x5f;
        if (pcVar13[uVar10] == ' ') {
          cVar11 = '\0';
        }
        uVar8 = uVar8 + ((int)cVar11 << (bVar4 & 0x1f));
        bVar4 = bVar4 + 5;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
  }
  else {
LAB_003bcae2:
    pcVar14 = pcVar13 + uVar12;
    uVar5 = 0x25;
    do {
      uVar5 = *pcVar13 * 0x12ca3 ^ uVar5 * 0xd32b;
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 != pcVar14);
    comm_00 = (string *)(ulong)(uVar5 & 0x1fffffff | 0x60000000);
LAB_003bcb0f:
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48);
    uVar8 = (uint32_t)comm_00;
    addCustomCommodity((units *)local_48,comm_00,code);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return uVar8;
}

Assistant:

uint32_t getCommodity(std::string comm)
{
    removeEscapeSequences(comm);
    std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityCodes.empty()) {
            auto fnd2 = customCommodityCodes.find(comm);
            if (fnd2 != customCommodityCodes.end()) {
                return fnd2->second;
            }
        }
    }

    auto fnd = commodities::commodity_codes.find(comm);
    if (fnd != commodities::commodity_codes.end()) {
        return fnd->second;
    }

    if (comm.compare(0, 7, "cxcomm[") == 0) {
        return strtoul(comm.c_str() + 7, nullptr, 0);
    }
    if ((comm.size() < 6) && std::all_of(comm.begin(), comm.end(), [](char x) {
            return (x == ' ' || (x >= '_' && x <= '}'));
        })) {
        std::uint32_t hkey{0x40000000};
        unsigned int shift{0};
        for (auto c : comm) {
            if (c == ' ') {
                c = '_';
            }
            c -= '_';
            hkey += static_cast<std::uint32_t>(c) << shift;
            shift += 5;
        }
        return hkey;
    }
    // generate a hash code for a custom string
    auto hcode = stringHash(comm);
    hcode &= 0x1FFFFFFFU;
    hcode |= 0x60000000U;
    addCustomCommodity(comm, hcode);

    return hcode;
}